

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall MacProj::test_umac_periodic(MacProj *this,int level,MultiFab *u_mac)

{
  int iVar1;
  Real RVar2;
  FabArrayId *pFVar3;
  bool bVar4;
  MultiFabId MVar5;
  BoxArray *src;
  Long LVar6;
  IntVect *v;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  reference pvVar10;
  int __c;
  int __c_00;
  long in_RDX;
  CoordSys *v_00;
  FabArrayCopyDescriptor<amrex::FArrayBox> *__s;
  Real max_norm;
  int dim_1;
  unsigned_long i_1;
  int nrecv;
  TURec r;
  Box *dstBox;
  Box *srcBox;
  int N;
  int i;
  int M;
  int iiv;
  Box eBox;
  MFIter mfi;
  Box eDomain;
  int dim;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> pshifts;
  vector<TURec,_std::allocator<TURec>_> pirm;
  MultiFabId mfid [3];
  MultiFabCopyDescriptor mfcd;
  FArrayBox diff;
  Geometry *geom;
  int in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  undefined4 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  int in_stack_fffffffffffffa88;
  int in_stack_fffffffffffffa8c;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  undefined8 in_stack_fffffffffffffaa0;
  Print *in_stack_fffffffffffffaa8;
  Print *in_stack_fffffffffffffab0;
  Box *in_stack_fffffffffffffab8;
  BoxArray *in_stack_fffffffffffffac0;
  FArrayBox *in_stack_fffffffffffffad8;
  FillBoxId *in_stack_fffffffffffffae0;
  FabArrayCopyDescriptor<amrex::FArrayBox> *in_stack_fffffffffffffae8;
  undefined8 in_stack_fffffffffffffaf0;
  Print *this_00;
  BoxList *in_stack_fffffffffffffaf8;
  Box *destFabBox;
  FabArrayCopyDescriptor<amrex::FArrayBox> *this_01;
  undefined1 *puVar11;
  FabArrayId fabarrayid;
  Box *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb28;
  Geometry *this_02;
  undefined1 *puVar12;
  FabArrayId *local_4b0;
  int in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  Box *in_stack_fffffffffffffc20;
  Box *in_stack_fffffffffffffc28;
  BaseFab<double> *in_stack_fffffffffffffc30;
  BaseFab<double> *in_stack_fffffffffffffc38;
  size_type local_310;
  int local_304;
  int local_300;
  undefined8 local_2fc;
  undefined8 uStack_2f4;
  undefined8 local_2ec;
  undefined8 uStack_2e4;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined4 local_2b8;
  undefined1 local_274 [28];
  undefined1 *local_258;
  Box *local_250;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  Box local_234;
  MFIter local_218;
  int local_1b4;
  CoordSys local_1b0;
  undefined1 local_158 [36];
  FabArrayId aFStack_134 [5];
  int in_stack_fffffffffffffee0;
  BaseFab<double> local_d8;
  Geometry *local_90;
  long local_88;
  char *local_70;
  int local_64;
  Box *local_60;
  int local_54;
  Geometry *local_50;
  undefined4 local_48;
  int local_44;
  undefined1 *local_40;
  int local_34;
  Real *local_30;
  int local_24;
  Real *local_20;
  int local_18;
  int local_14;
  Real *local_10;
  int local_4;
  
  local_88 = in_RDX;
  local_90 = amrex::AmrMesh::Geom
                       ((AmrMesh *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                        in_stack_fffffffffffffa7c);
  bVar4 = amrex::Geometry::isAnyPeriodic
                    ((Geometry *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  if (bVar4) {
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    amrex::MultiFabCopyDescriptor::MultiFabCopyDescriptor((MultiFabCopyDescriptor *)0x848d9d);
    pFVar3 = (FabArrayId *)(local_158 + 0x18);
    do {
      local_4b0 = pFVar3;
      amrex::FabArrayId::FabArrayId(local_4b0,-1);
      pFVar3 = local_4b0 + 1;
    } while (local_4b0 + 1 != aFStack_134);
    std::vector<TURec,_std::allocator<TURec>_>::vector
              ((vector<TURec,_std::allocator<TURec>_> *)0x848e08);
    puVar12 = (undefined1 *)((long)local_1b0.inv_dx + 7);
    std::allocator<amrex::IntVect>::allocator((allocator<amrex::IntVect> *)0x848e1d);
    amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
               (allocator_type *)0x848e37);
    std::allocator<amrex::IntVect>::~allocator((allocator<amrex::IntVect> *)0x848e46);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x848e53);
    for (local_1b0.offset[2]._4_4_ = 0; local_1b0.offset[2]._4_4_ < 3;
        local_1b0.offset[2]._4_4_ = local_1b0.offset[2]._4_4_ + 1) {
      bVar4 = amrex::Geometry::isPeriodic(local_90,local_1b0.offset[2]._4_4_);
      if (bVar4) {
        local_60 = amrex::Geometry::Domain(local_90);
        local_64 = local_1b0.offset[2]._4_4_;
        local_1b0.c_sys = (local_60->smallend).vect[0];
        local_1b0._4_4_ = (local_60->smallend).vect[1];
        local_1b0.offset[0] = *(Real *)((local_60->smallend).vect + 2);
        local_1b0.offset[1] = *(Real *)((local_60->bigend).vect + 1);
        local_1b0.offset[2]._0_4_ = (local_60->btype).itype;
        this_02 = (Geometry *)&local_1b0;
        local_54 = local_1b0.offset[2]._4_4_;
        local_30 = local_1b0.offset + 2;
        local_34 = local_1b0.offset[2]._4_4_;
        local_24 = local_1b0.offset[2]._4_4_;
        local_18 = local_1b0.offset[2]._4_4_;
        if ((local_1b0.offset[2]._0_4_ & 1 << ((byte)local_1b0.offset[2]._4_4_ & 0x1f)) == 0) {
          puVar11 = (undefined1 *)((long)local_1b0.offset + 4);
          local_44 = local_1b0.offset[2]._4_4_;
          local_48 = 1;
          *(int *)(puVar11 + (long)local_1b0.offset[2]._4_4_ * 4) =
               *(int *)(puVar11 + (long)local_1b0.offset[2]._4_4_ * 4) + 1;
          local_10 = local_1b0.offset + 2;
          local_14 = local_1b0.offset[2]._4_4_;
          local_4 = local_1b0.offset[2]._4_4_;
          local_1b0.offset[2]._0_4_ =
               1 << ((byte)local_1b0.offset[2]._4_4_ & 0x1f) | local_1b0.offset[2]._0_4_;
          local_40 = puVar11;
        }
        local_50 = this_02;
        local_20 = local_30;
        MVar5 = amrex::MultiFabCopyDescriptor::RegisterMultiFab
                          ((MultiFabCopyDescriptor *)
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                           (MultiFab *)0x84903b);
        aFStack_134[(long)local_1b0.offset[2]._4_4_ + -3].fabArrayId = MVar5.fabArrayId;
        v_00 = (CoordSys *)(local_88 + (long)local_1b0.offset[2]._4_4_ * 0x180);
        local_1b4 = MVar5.fabArrayId;
        amrex::MFIter::MFIter
                  ((MFIter *)in_stack_fffffffffffffab0,(FabArrayBase *)in_stack_fffffffffffffaa8,
                   (uchar)((ulong)in_stack_fffffffffffffaa0 >> 0x38));
        while (bVar4 = amrex::MFIter::isValid(&local_218), bVar4) {
          src = amrex::FabArrayBase::boxArray
                          ((FabArrayBase *)(local_88 + (long)local_1b0.offset[2]._4_4_ * 0x180));
          amrex::MFIter::index(&local_218,(char *)v_00,__c);
          amrex::BoxArray::operator[]
                    ((BoxArray *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                     in_stack_fffffffffffffa8c);
          v_00 = &local_1b0;
          amrex::Geometry::periodicShift
                    (this_02,(Box *)CONCAT44(MVar5.fabArrayId,in_stack_fffffffffffffb28),(Box *)src,
                     (Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_fffffffffffffb18);
          local_238 = 0;
          LVar6 = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::size
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x8491b6);
          local_23c = (int)LVar6;
          for (; local_238 < local_23c; local_238 = local_238 + 1) {
            v = amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                          ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                           CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            in_stack_fffffffffffffb18 = &local_234;
            amrex::Box::operator+=(in_stack_fffffffffffffb18,v);
            amrex::FabArrayBase::boxArray
                      ((FabArrayBase *)(local_88 + (long)local_1b0.offset[2]._4_4_ * 0x180));
            amrex::BoxArray::intersections
                      (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                       (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)in_stack_fffffffffffffab0);
            local_240 = 0;
            sVar7 = std::
                    vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ::size((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            *)local_1b0.dx);
            local_244 = (int)sVar7;
            for (; local_240 < local_244; local_240 = local_240 + 1) {
              pvVar8 = std::
                       vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ::operator[]((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     *)local_1b0.dx,(long)local_240);
              __s = (FabArrayCopyDescriptor<amrex::FArrayBox> *)&pvVar8->second;
              local_250 = (Box *)__s;
              amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                        ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                         CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                         CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              puVar11 = local_274;
              this_01 = __s;
              amrex::Box::operator-
                        ((Box *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                         (IntVect *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              local_258 = puVar11;
              amrex::MFIter::index(&local_218,(char *)__s,__c_00);
              fabarrayid.fabArrayId = (int)((ulong)puVar11 >> 0x20);
              TURec::TURec((TURec *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                           in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88,
                           (Box *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           (Box *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
              local_300 = aFStack_134[(long)local_1b0.offset[2]._4_4_ + -3].fabArrayId;
              destFabBox = local_250;
              std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
              ::operator[]((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            *)local_1b0.dx,(long)local_240);
              in_stack_fffffffffffffa90 = 1;
              in_stack_fffffffffffffa88 = 1;
              in_stack_fffffffffffffa80 = 0;
              in_stack_fffffffffffffa78 = 0;
              amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
                        (this_01,fabarrayid,destFabBox,in_stack_fffffffffffffaf8,
                         (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),(int)this_02,(int)puVar12,
                         (int)local_4b0,SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x18,0));
              local_2b8 = local_2dc;
              local_2c8 = local_2ec;
              uStack_2c0 = uStack_2e4;
              local_2d8 = local_2fc;
              uStack_2d0 = uStack_2f4;
              std::vector<TURec,_std::allocator<TURec>_>::push_back
                        ((vector<TURec,_std::allocator<TURec>_> *)
                         CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                         (value_type *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88)
                        );
            }
            v_00 = (CoordSys *)
                   amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                             ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                              CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                              CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            amrex::Box::operator-=(&local_234,(IntVect *)v_00);
          }
          amrex::MFIter::operator++(&local_218);
        }
        amrex::MFIter::~MFIter
                  ((MFIter *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
      }
    }
    sVar7 = std::vector<TURec,_std::allocator<TURec>_>::size
                      ((vector<TURec,_std::allocator<TURec>_> *)local_158);
    local_304 = (int)sVar7;
    amrex::ParallelDescriptor::ReduceIntMax(&local_304);
    if (local_304 != 0) {
      amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::CollectData
                ((FabArrayCopyDescriptor<amrex::FArrayBox> *)0x8494d3);
      local_310 = 0;
      while (sVar7 = local_310,
            sVar9 = std::vector<TURec,_std::allocator<TURec>_>::size
                              ((vector<TURec,_std::allocator<TURec>_> *)local_158), sVar7 < sVar9) {
        this_00 = (Print *)local_158;
        pvVar10 = std::vector<TURec,_std::allocator<TURec>_>::operator[]
                            ((vector<TURec,_std::allocator<TURec>_> *)this_00,local_310);
        iVar1 = pvVar10->m_dim;
        std::vector<TURec,_std::allocator<TURec>_>::operator[]
                  ((vector<TURec,_std::allocator<TURec>_> *)this_00,local_310);
        amrex::FArrayBox::resize
                  ((FArrayBox *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                   (Box *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
                   in_stack_fffffffffffffa84,
                   (Arena *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
        std::vector<TURec,_std::allocator<TURec>_>::operator[]
                  ((vector<TURec,_std::allocator<TURec>_> *)local_158,local_310);
        amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                  (in_stack_fffffffffffffae8,(FabArrayId)(int)((ulong)this_00 >> 0x20),
                   in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        in_stack_fffffffffffffad8 = (FArrayBox *)(local_88 + (long)iVar1 * 0x180);
        std::vector<TURec,_std::allocator<TURec>_>::operator[]
                  ((vector<TURec,_std::allocator<TURec>_> *)local_158,local_310);
        in_stack_fffffffffffffae0 =
             (FillBoxId *)
             amrex::FabArray<amrex::FArrayBox>::operator[]
                       ((FabArray<amrex::FArrayBox> *)
                        CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                        in_stack_fffffffffffffa7c);
        pvVar10 = std::vector<TURec,_std::allocator<TURec>_>::operator[]
                            ((vector<TURec,_std::allocator<TURec>_> *)local_158,local_310);
        in_stack_fffffffffffffae8 = (FabArrayCopyDescriptor<amrex::FArrayBox> *)&pvVar10->m_dstBox;
        amrex::BaseFab<double>::box(&local_d8);
        in_stack_fffffffffffffa78 = 1;
        amrex::BaseFab<double>::minus<(amrex::RunOn)1>
                  (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                   in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18,
                   in_stack_fffffffffffffee0);
        RVar2 = amrex::BaseFab<double>::norm<(amrex::RunOn)1>
                          ((BaseFab<double> *)
                           CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                           in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78,0);
        if ((anonymous_namespace)::umac_periodic_test_Tol < RVar2) {
          amrex::OutStream();
          amrex::Print::Print(in_stack_fffffffffffffab0,(ostream *)in_stack_fffffffffffffaa8);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (char (*) [7])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (int *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (char (*) [15])CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          in_stack_fffffffffffffab0 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (double *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          in_stack_fffffffffffffaa8 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                          (char (*) [14])
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          std::vector<TURec,_std::allocator<TURec>_>::operator[]
                    ((vector<TURec,_std::allocator<TURec>_> *)local_158,local_310);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (Box *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                      *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          amrex::Print::~Print(this_00);
          local_70 = "Periodic bust in u_mac";
          amrex::Error_host((char *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
        }
        local_310 = local_310 + 1;
      }
    }
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    amrex::Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x8497f0);
    std::vector<TURec,_std::allocator<TURec>_>::~vector
              ((vector<TURec,_std::allocator<TURec>_> *)
               CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
    amrex::MultiFabCopyDescriptor::~MultiFabCopyDescriptor((MultiFabCopyDescriptor *)0x84980a);
    amrex::FArrayBox::~FArrayBox((FArrayBox *)0x849817);
  }
  return;
}

Assistant:

void
MacProj::test_umac_periodic (int       level,
                             MultiFab* u_mac)
{
    const Geometry& geom = parent->Geom(level);

    if (!geom.isAnyPeriodic()) return;

    FArrayBox              diff;
    MultiFabCopyDescriptor mfcd;
    MultiFabId             mfid[BL_SPACEDIM];
    std::vector<TURec>     pirm;
    Vector<IntVect>         pshifts(27);
    std::vector< std::pair<int,Box> > isects;


    for (int dim = 0; dim < BL_SPACEDIM; dim++)
    {
        if (geom.isPeriodic(dim))
        {
            Box eDomain = amrex::surroundingNodes(geom.Domain(),dim);

            mfid[dim] = mfcd.RegisterMultiFab(&u_mac[dim]);

            // How to combine pirm into one global pirm?
            // don't think std::vector::push_back() is thread safe
            // #ifdef _OPENMP
            // #pragma omp parallel
            // #endif
            // {
            //             std::vector<TURec>     pirm;
            //             std::vector< std::pair<int,Box> > isects;
            //             Vector<IntVect>         pshifts(27);

            for (MFIter mfi(u_mac[dim]); mfi.isValid(); ++mfi)
            {
                Box eBox = u_mac[dim].boxArray()[mfi.index()];

                geom.periodicShift(eDomain, eBox, pshifts);

                for (int iiv = 0, M = pshifts.size(); iiv < M; iiv++)
                {
                    eBox += pshifts[iiv];

                    u_mac[dim].boxArray().intersections(eBox,isects);

                    for (int i = 0, N = isects.size(); i < N; i++)
                    {
                        const Box& srcBox = isects[i].second;
                        const Box& dstBox = srcBox - pshifts[iiv];

                        TURec r(mfi.index(),dim,srcBox,dstBox);

                        r.m_fbid = mfcd.AddBox(mfid[dim],
                                               srcBox,
                                               0,
                                               isects[i].first,
                                               0,
                                               0,
                                               1);
                        pirm.push_back(r);
                    }

                    eBox -= pshifts[iiv];
                }
            }
            // }// end OMP region
        }
    }

    int nrecv = pirm.size();
    ParallelDescriptor::ReduceIntMax(nrecv);
    if (nrecv == 0)
        //
        // There's no parallel work to do.
        //
        return;

    mfcd.CollectData();

    for (long unsigned int i = 0; i < pirm.size(); i++)
    {
        const int dim = pirm[i].m_dim;

        BL_ASSERT(pirm[i].m_fbid.box() == pirm[i].m_srcBox);
        BL_ASSERT(pirm[i].m_srcBox.sameSize(pirm[i].m_dstBox));
        BL_ASSERT(u_mac[dim].DistributionMap()[pirm[i].m_idx] == ParallelDescriptor::MyProc());

        diff.resize(pirm[i].m_srcBox, 1);

        mfcd.FillFab(mfid[dim], pirm[i].m_fbid, diff);

        diff.minus<RunOn::Host>(u_mac[dim][pirm[i].m_idx],pirm[i].m_dstBox,diff.box(),0,0,1);

        const Real max_norm = diff.norm<RunOn::Host>(0);

        if (max_norm > umac_periodic_test_Tol )
        {
            amrex::Print() << "dir = "         << dim
                           << ", diff norm = " << max_norm
                           << " for region: "  << pirm[i].m_dstBox << std::endl;
            amrex::Error("Periodic bust in u_mac");
        }
    }
}